

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O1

size_t HUF_decompress1X2_usingDTable_internal
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,int bmi2)

{
  undefined2 *puVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  ulong *puVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  undefined2 *puVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  bool bVar16;
  
  if (bmi2 != 0) {
    if (cSrcSize == 0) {
      cSrcSize = 0xfffffffffffffffd;
      uVar5 = 0;
      uVar8 = 0;
      puVar15 = (ulong *)0x0;
      cSrc = (ulong *)0x0;
      puVar7 = (ulong *)0x0;
    }
    else {
      puVar7 = (ulong *)((long)cSrc + 8);
      if (cSrcSize < 8) {
        uVar8 = (ulong)*cSrc;
        switch(cSrcSize) {
        case 7:
          uVar8 = uVar8 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
        case 6:
          uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
        case 5:
          uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
        case 4:
          uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
        case 3:
          uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
        case 2:
          uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
        default:
          bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
          uVar3 = 0x1f;
          if (bVar6 != 0) {
            for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          if (bVar6 == 0) {
            cSrcSize = 0xfffffffffffffffc;
            uVar3 = 0;
          }
          else {
            uVar3 = ~uVar3 + (int)cSrcSize * -8 + 0x49;
          }
          uVar5 = (ulong)uVar3;
          puVar15 = (ulong *)cSrc;
        }
      }
      else {
        puVar15 = (ulong *)((long)cSrc + (cSrcSize - 8));
        uVar8 = *puVar15;
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar3 = 0x1f;
        if (bVar6 != 0) {
          for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar3 = ~uVar3 + 9;
        if (bVar6 == 0) {
          uVar3 = 0;
        }
        uVar5 = (ulong)uVar3;
        cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
      }
    }
    if (0xfffffffffffffff7 < cSrcSize) {
      return cSrcSize;
    }
    puVar1 = (undefined2 *)((long)dst + dstSize);
    uVar3 = *DTable;
    puVar11 = (undefined2 *)((long)dst + (dstSize - 7));
    uVar4 = -(uVar3 >> 0x10) & 0x3f;
    do {
      uVar12 = (uint)uVar5;
      if (uVar12 < 0x41) {
        if (puVar15 < puVar7) {
          if (puVar15 == (ulong *)cSrc) goto LAB_001a45d8;
          bVar16 = cSrc <= (ulong *)((long)puVar15 - (uVar5 >> 3));
          uVar10 = (int)puVar15 - (int)cSrc;
          if (bVar16) {
            uVar10 = (uint)(uVar5 >> 3);
          }
          uVar12 = uVar12 + uVar10 * -8;
        }
        else {
          uVar10 = (uint)(uVar5 >> 3);
          uVar12 = uVar12 & 7;
          bVar16 = true;
        }
        uVar5 = (ulong)uVar12;
        puVar15 = (ulong *)((long)puVar15 - (ulong)uVar10);
        uVar8 = *puVar15;
      }
      else {
LAB_001a45d8:
        bVar16 = false;
      }
      if ((puVar11 <= dst) || (!bVar16)) goto LAB_001a46dc;
      uVar13 = (uVar8 << (uVar5 & 0x3f)) >> uVar4;
      *(short *)dst = (short)DTable[uVar13 + 1];
      uVar12 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + (int)uVar5;
      uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
      uVar5 = (uVar8 << ((ulong)uVar12 & 0x3f)) >> uVar4;
      *(short *)((long)dst + uVar13) = (short)DTable[uVar5 + 1];
      uVar12 = *(byte *)((long)DTable + uVar5 * 4 + 6) + uVar12;
      uVar5 = (ulong)*(byte *)((long)DTable + uVar5 * 4 + 7);
      lVar2 = uVar5 + uVar13;
      uVar14 = (uVar8 << ((ulong)uVar12 & 0x3f)) >> uVar4;
      *(short *)((long)dst + uVar5 + uVar13) = (short)DTable[uVar14 + 1];
      uVar12 = *(byte *)((long)DTable + uVar14 * 4 + 6) + uVar12;
      uVar14 = (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7);
      uVar13 = (uVar8 << ((ulong)uVar12 & 0x3f)) >> uVar4;
      *(short *)((long)dst + uVar14 + lVar2) = (short)DTable[uVar13 + 1];
      uVar5 = (ulong)(*(byte *)((long)DTable + uVar13 * 4 + 6) + uVar12);
      dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7) + uVar14 + lVar2);
    } while( true );
  }
  if (cSrcSize == 0) {
    cSrcSize = 0xfffffffffffffffd;
    uVar5 = 0;
    uVar8 = 0;
    puVar15 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar7 = (ulong *)0x0;
  }
  else {
    puVar7 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar8 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar8 = uVar8 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar8 = uVar8 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar8 = uVar8 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar3 = 0x1f;
        if (bVar6 != 0) {
          for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        if (bVar6 == 0) {
          cSrcSize = 0xfffffffffffffffc;
          uVar3 = 0;
        }
        else {
          uVar3 = ~uVar3 + (int)cSrcSize * -8 + 0x49;
        }
        uVar5 = (ulong)uVar3;
        puVar15 = (ulong *)cSrc;
      }
    }
    else {
      puVar15 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar8 = *puVar15;
      bVar6 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar3 = 0x1f;
      if (bVar6 != 0) {
        for (; bVar6 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = ~uVar3 + 9;
      if (bVar6 == 0) {
        uVar3 = 0;
      }
      uVar5 = (ulong)uVar3;
      cSrcSize = cSrcSize | -(ulong)(bVar6 == 0);
    }
  }
  if (0xfffffffffffffff7 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined2 *)((long)dst + dstSize);
  puVar11 = (undefined2 *)((long)dst + (dstSize - 7));
  bVar6 = -(char)*(undefined2 *)((long)DTable + 2) & 0x3f;
  do {
    uVar3 = (uint)uVar5;
    if (uVar3 < 0x41) {
      if (puVar15 < puVar7) {
        if (puVar15 == (ulong *)cSrc) goto LAB_001a0adb;
        bVar16 = cSrc <= (ulong *)((long)puVar15 - (uVar5 >> 3));
        uVar4 = (int)puVar15 - (int)cSrc;
        if (bVar16) {
          uVar4 = (uint)(uVar5 >> 3);
        }
        uVar3 = uVar3 + uVar4 * -8;
      }
      else {
        uVar4 = (uint)(uVar5 >> 3);
        uVar3 = uVar3 & 7;
        bVar16 = true;
      }
      uVar5 = (ulong)uVar3;
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar4);
      uVar8 = *puVar15;
    }
    else {
LAB_001a0adb:
      bVar16 = false;
    }
    if ((puVar11 <= dst) || (!bVar16)) goto LAB_001a0be6;
    uVar13 = (uVar8 << ((byte)uVar5 & 0x3f)) >> bVar6;
    *(short *)dst = (short)DTable[uVar13 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + (int)uVar5;
    uVar5 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
    uVar13 = (uVar8 << ((byte)iVar9 & 0x3f)) >> bVar6;
    *(short *)((long)dst + uVar5) = (short)DTable[uVar13 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9;
    uVar14 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
    lVar2 = uVar14 + uVar5;
    uVar13 = (uVar8 << ((byte)iVar9 & 0x3f)) >> bVar6;
    *(short *)((long)dst + uVar14 + uVar5) = (short)DTable[uVar13 + 1];
    iVar9 = (uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + iVar9;
    uVar14 = (uVar8 << ((byte)iVar9 & 0x3f)) >> bVar6;
    uVar13 = (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7);
    *(short *)((long)dst + uVar13 + lVar2) = (short)DTable[uVar14 + 1];
    uVar5 = (ulong)((uint)*(byte *)((long)DTable + uVar14 * 4 + 6) + iVar9);
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar14 * 4 + 7) + uVar13 + lVar2);
  } while( true );
LAB_001a46dc:
  puVar11 = puVar1 + -1;
  do {
    uVar12 = (uint)uVar5;
    if (uVar12 < 0x41) {
      if (puVar15 < puVar7) {
        if (puVar15 == (ulong *)cSrc) goto LAB_001a46eb;
        bVar16 = cSrc <= (ulong *)((long)puVar15 - (uVar5 >> 3));
        uVar10 = (int)puVar15 - (int)cSrc;
        if (bVar16) {
          uVar10 = (uint)(uVar5 >> 3);
        }
        uVar12 = uVar12 + uVar10 * -8;
      }
      else {
        uVar10 = (uint)(uVar5 >> 3);
        uVar12 = uVar12 & 7;
        bVar16 = true;
      }
      uVar5 = (ulong)uVar12;
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar10);
      uVar8 = *puVar15;
    }
    else {
LAB_001a46eb:
      bVar16 = false;
    }
    if ((puVar11 < dst) || (!bVar16)) {
      for (; uVar12 = (uint)uVar5, dst <= puVar11;
          dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7))) {
        uVar13 = (uVar8 << (uVar5 & 0x3f)) >> uVar4;
        *(short *)dst = (short)DTable[uVar13 + 1];
        uVar5 = (ulong)(*(byte *)((long)DTable + uVar13 * 4 + 6) + uVar12);
      }
      if (dst < puVar1) {
        uVar8 = (uVar8 << (uVar5 & 0x3f)) >> ((ulong)(byte)-(char)(uVar3 >> 0x10) & 0x3f);
        *(char *)dst = (char)DTable[uVar8 + 1];
        if (*(char *)((long)DTable + uVar8 * 4 + 7) == '\x01') {
          uVar12 = uVar12 + *(byte *)((long)DTable + uVar8 * 4 + 6);
        }
        else if (uVar12 < 0x40) {
          uVar3 = uVar12 + *(byte *)((long)DTable + uVar8 * 4 + 6);
          uVar12 = 0x40;
          if (uVar3 < 0x40) {
            uVar12 = uVar3;
          }
        }
      }
      if (uVar12 != 0x40) {
        dstSize = 0xfffffffffffffffc;
      }
      if (puVar15 != (ulong *)cSrc) {
        dstSize = 0xfffffffffffffffc;
      }
      return dstSize;
    }
    uVar13 = (uVar8 << (uVar5 & 0x3f)) >> uVar4;
    *(short *)dst = (short)DTable[uVar13 + 1];
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
    uVar5 = (ulong)((uint)*(byte *)((long)DTable + uVar13 * 4 + 6) + (int)uVar5);
  } while( true );
LAB_001a0be6:
  puVar11 = puVar1 + -1;
  do {
    uVar3 = (uint)uVar5;
    if (uVar3 < 0x41) {
      if (puVar15 < puVar7) {
        if (puVar15 == (ulong *)cSrc) goto LAB_001a0bef;
        bVar16 = cSrc <= (ulong *)((long)puVar15 - (uVar5 >> 3));
        uVar4 = (int)puVar15 - (int)cSrc;
        if (bVar16) {
          uVar4 = (uint)(uVar5 >> 3);
        }
        uVar3 = uVar3 + uVar4 * -8;
      }
      else {
        uVar4 = (uint)(uVar5 >> 3);
        uVar3 = uVar3 & 7;
        bVar16 = true;
      }
      uVar5 = (ulong)uVar3;
      puVar15 = (ulong *)((long)puVar15 - (ulong)uVar4);
      uVar8 = *puVar15;
    }
    else {
LAB_001a0bef:
      bVar16 = false;
    }
    if ((puVar11 < dst) || (!bVar16)) {
      while( true ) {
        uVar3 = (uint)uVar5;
        if (puVar11 < dst) break;
        uVar13 = (uVar8 << ((byte)uVar5 & 0x3f)) >> bVar6;
        *(short *)dst = (short)DTable[uVar13 + 1];
        uVar5 = (ulong)(uVar3 + *(byte *)((long)DTable + uVar13 * 4 + 6));
        dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
      }
      if (dst < puVar1) {
        uVar8 = (uVar8 << ((byte)uVar5 & 0x3f)) >> bVar6;
        *(char *)dst = (char)DTable[uVar8 + 1];
        if (*(char *)((long)DTable + uVar8 * 4 + 7) == '\x01') {
          uVar3 = uVar3 + *(byte *)((long)DTable + uVar8 * 4 + 6);
        }
        else if (uVar3 < 0x40) {
          uVar4 = uVar3 + *(byte *)((long)DTable + uVar8 * 4 + 6);
          uVar3 = 0x40;
          if (uVar4 < 0x40) {
            uVar3 = uVar4;
          }
        }
      }
      if (uVar3 != 0x40) {
        dstSize = 0xfffffffffffffffc;
      }
      if (puVar15 != (ulong *)cSrc) {
        dstSize = 0xfffffffffffffffc;
      }
      return dstSize;
    }
    uVar13 = (uVar8 << ((byte)uVar5 & 0x3f)) >> bVar6;
    *(short *)dst = (short)DTable[uVar13 + 1];
    uVar5 = (ulong)((int)uVar5 + (uint)*(byte *)((long)DTable + uVar13 * 4 + 6));
    dst = (void *)((long)dst + (ulong)*(byte *)((long)DTable + uVar13 * 4 + 7));
  } while( true );
}

Assistant:

HUF_DGEN(HUF_decompress1X2_usingDTable_internal)
HUF_DGEN(HUF_decompress4X2_usingDTable_internal)

size_t HUF_decompress1X2_usingDTable(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable)
{
    DTableDesc dtd = HUF_getDTableDesc(DTable);
    if (dtd.tableType != 1) return ERROR(GENERIC);
    return HUF_decompress1X2_usingDTable_internal(dst, dstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
}